

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O2

void __thiscall
duckdb::LocalFileSecretStorage::RemoveSecret
          (LocalFileSecretStorage *this,string *secret,OnEntryNotFound on_entry_not_found)

{
  LocalFileSystem fs;
  string file;
  ErrorData error;
  
  fs.super_FileSystem._vptr_FileSystem = (FileSystem)&PTR__FileSystem_0177c1f8;
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,
                   secret,".duckdb_secret");
  FileSystem::JoinPath(&file,&fs.super_FileSystem,&this->secret_path,(string *)&error);
  ::std::__cxx11::string::~string((string *)&error);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_M_erase(&(this->persistent_secrets)._M_h,secret);
  LocalFileSystem::RemoveFile(&fs,&file,(optional_ptr<duckdb::FileOpener,_true>)0x0);
  ::std::__cxx11::string::~string((string *)&file);
  FileSystem::~FileSystem(&fs.super_FileSystem);
  return;
}

Assistant:

void LocalFileSecretStorage::RemoveSecret(const string &secret, OnEntryNotFound on_entry_not_found) {
	LocalFileSystem fs;
	string file = fs.JoinPath(secret_path, secret + ".duckdb_secret");
	persistent_secrets.erase(secret);
	try {
		fs.RemoveFile(file);
	} catch (std::exception &ex) {
		ErrorData error(ex);
		if (error.Type() == ExceptionType::IO) {
			throw IOException("Failed to remove secret file '%s', the file may have been removed by another duckdb "
			                  "instance. (original error: '%s')",
			                  file, error.RawMessage());
		}
		throw;
	}
}